

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Capturer::captureValue(Capturer *this,size_t index,string *value)

{
  pointer pMVar1;
  ulong uVar2;
  
  pMVar1 = (this->m_messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_messages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) * -0x71c71c71c71c71c7;
  if (index <= uVar2 && uVar2 - index != 0) {
    std::__cxx11::string::_M_append((char *)&pMVar1[index].message,(ulong)(value->_M_dataplus)._M_p)
    ;
    (*this->m_resultCapture->_vptr_IResultCapture[0xc])
              (this->m_resultCapture,
               (this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_start + index);
    this->m_captured = this->m_captured + 1;
    return;
  }
  __assert_fail("index < m_messages.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x39a,"void Catch::Capturer::captureValue(size_t, const std::string &)");
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }